

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::createDFDCompressedTest1_FormatBC1_Test::
~createDFDCompressedTest1_FormatBC1_Test(createDFDCompressedTest1_FormatBC1_Test *this)

{
  void *in_RDI;
  
  ~createDFDCompressedTest1_FormatBC1_Test((createDFDCompressedTest1_FormatBC1_Test *)0x14ae88);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

TEST_F(createDFDCompressedTest1, FormatBC1) {
    customize(KHR_DF_MODEL_BC1A, KHR_DF_PRIMARIES_BT709,
              KHR_DF_TRANSFER_LINEAR, KHR_DF_FLAG_ALPHA_STRAIGHT,
              3, 3,
              {
                {0, 63, KHR_DF_CHANNEL_BC1A_COLOR, 0, 0, 0, 0, 0, 0xFFFFFFFF},
              }
             );

    uint32_t* dfd = createDFDCompressed(c_BC1_RGB, 4, 4, 1, s_UNORM);

    EXPECT_EQ(*dfd, sizeof(expected) + 4U);
    EXPECT_EQ(memcmp(&expected, dfd+1, sizeof(expected)), 0);

    free(dfd);
}